

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::JumpStatementSyntax::setChild
          (JumpStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00536948 + *(int *)(&DAT_00536948 + index * 4)))();
  return;
}

Assistant:

void JumpStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: breakOrContinue = child.token(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}